

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

optional_ptr<duckdb::ProfilingNode,_true> __thiscall
duckdb::Connection::GetProfilingTree(Connection *this)

{
  type pCVar1;
  QueryProfiler *pQVar2;
  Exception *this_00;
  allocator local_39;
  string local_38;
  
  pCVar1 = shared_ptr<duckdb::ClientContext,_true>::operator*(&this->context);
  if ((pCVar1->config).enable_profiler != false) {
    pCVar1 = shared_ptr<duckdb::ClientContext,_true>::operator*(&this->context);
    pQVar2 = QueryProfiler::Get(pCVar1);
    return (optional_ptr<duckdb::ProfilingNode,_true>)
           (pQVar2->root).
           super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>._M_t
           .
           super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>
           .super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Profiling is not enabled for this connection",&local_39);
  Exception::Exception(this_00,SETTINGS,&local_38);
  __cxa_throw(this_00,&Exception::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

optional_ptr<ProfilingNode> Connection::GetProfilingTree() {
	auto &client_config = ClientConfig::GetConfig(*context);
	auto enable_profiler = client_config.enable_profiler;

	if (!enable_profiler) {
		throw Exception(ExceptionType::SETTINGS, "Profiling is not enabled for this connection");
	}
	auto &profiler = QueryProfiler::Get(*context);
	return profiler.GetRoot();
}